

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalAnalyzer.cpp
# Opt level: O2

void __thiscall LexicalAnalyzer::RemoveComment(LexicalAnalyzer *this)

{
  long lVar1;
  pointer pbVar2;
  long lVar3;
  iterator iter;
  const_iterator __position;
  int i;
  ulong uVar4;
  
  lVar3 = 0;
  uVar4 = 0;
  while( true ) {
    __position._M_current =
         (this->lines).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (this->lines).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)pbVar2 - (long)__position._M_current >> 5) <= uVar4) break;
    lVar1 = std::__cxx11::string::find
                      ((char *)((long)&((__position._M_current)->_M_dataplus)._M_p + lVar3),0x11f130
                      );
    if (lVar1 << 0x20 != -0x100000000) {
      std::__cxx11::string::erase
                ((long)&(((this->lines).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar3,
                 (lVar1 << 0x20) >> 0x20);
    }
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x20;
  }
  while (__position._M_current != pbVar2) {
    if ((__position._M_current)->_M_string_length == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase(&this->lines,__position);
      pbVar2 = (this->lines).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      __position._M_current = __position._M_current + 1;
    }
  }
  return;
}

Assistant:

void LexicalAnalyzer::RemoveComment() {
    for (int i = 0; i < lines.size(); i++) {
        //std::cout<<lines[i]<<std::endl;
        int pos = lines[i].find("//");//double //
        if (pos != std::string::npos) {//Find double //
            lines[i].erase(pos);//Erase [pos,]
        }
    }
    // erase empty string in lines
    for (std::vector<std::string>::iterator iter = lines.begin(); iter != lines.end();) {
        if (iter->empty()) {
            lines.erase(iter);
        } else
            iter++;
    }
}